

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<long_double>::Print
          (TPZBlockDiagonal<long_double> *this,char *msg,ostream *out,MatrixOutputFormat format)

{
  char cVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char local_59;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (format == EFormatted) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"TPZBlockDiagonal matrix ",0x18);
    if (msg != (char *)0x0) {
      sVar2 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>(out,msg,sVar2);
    }
    cVar1 = (char)out;
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    lVar4 = (this->fBlockSize).fNElements;
    std::__ostream_insert<char,std::char_traits<char>>(out,"Number of blocks ",0x11);
    poVar3 = std::ostream::_M_insert<long>((long)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (0 < lVar4) {
      lVar7 = 0;
      local_50 = lVar4;
      do {
        lVar4 = (long)(this->fBlockSize).fStore[lVar7];
        std::__ostream_insert<char,std::char_traits<char>>(out,"block number ",0xd);
        local_58 = lVar7;
        poVar3 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," size : ",8);
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (0 < lVar4) {
          lVar6 = (this->fBlockPos).fStore[local_58] << 4;
          local_48 = lVar4 << 4;
          lVar5 = 0;
          local_40 = lVar4;
          lVar7 = lVar6;
          do {
            do {
              local_38 = lVar7;
              poVar3 = std::ostream::_M_insert<long_double>
                                 (*(longdouble *)((long)(this->fStorage).fStore + lVar6));
              local_59 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
              lVar6 = lVar6 + 0x10;
              lVar4 = lVar4 + -1;
              lVar7 = local_38;
            } while (lVar4 != 0);
            std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
            std::ostream::put(cVar1);
            std::ostream::flush();
            lVar5 = lVar5 + 1;
            lVar6 = local_38 + local_48;
            lVar4 = local_40;
            lVar7 = lVar6;
          } while (lVar5 != local_40);
        }
        lVar7 = local_58 + 1;
      } while (lVar7 != local_50);
    }
    return;
  }
  TPZMatrix<long_double>::Print(&this->super_TPZMatrix<long_double>,msg,out,format);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Print(const char *msg, std::ostream &out, const MatrixOutputFormat format) const {
	
	if(format != EFormatted)
	{
		TPZMatrix<TVar>::Print(msg,out,format);
		return;
	}
	out << "TPZBlockDiagonal matrix ";
	if(msg) out << msg;
	out  << std::endl;
	
	int64_t nblock = fBlockSize.NElements();
	out << "Number of blocks " << nblock << std::endl; 
	int64_t b,bsize,pos;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		out << "block number " << b << " size : " << bsize << std::endl;
		int64_t r,c;
		pos = fBlockPos[b];
		for(c=0; c<bsize; c++) {
			for(r=0; r<bsize ; r++) {
				out << fStorage[pos+r+bsize*c] << ' ';
			}
			out << std::endl;
		}
	}
}